

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingComponentWithoutLocationTest *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  char *pcVar4;
  stringstream stream;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentWithoutLocationTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(&local_1a0,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," type: ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type);
  poVar2 = std::operator<<(poVar2,pGVar3);
  std::operator<<(poVar2,", direction: ");
  pcVar4 = "output";
  if (ptVar1[test_case_index].m_is_input != false) {
    pcVar4 = "input";
  }
  std::operator<<(&local_1a0,pcVar4);
  poVar2 = std::operator<<(&local_1a0,", component: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingComponentWithoutLocationTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage)
		   << " type: " << test_case.m_type.GetGLSLTypeName() << ", direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	stream << ", component: " << test_case.m_component;

	return stream.str();
}